

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHTTP.cpp
# Opt level: O0

void __thiscall
adios2::transport::FileHTTP::Read(FileHTTP *this,char *buffer,size_t size,size_t start)

{
  int iVar1;
  char *__format;
  undefined8 uVar2;
  undefined8 uVar3;
  ssize_t sVar4;
  long in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  int read_len;
  size_t remaining;
  size_t bytes_recd;
  int nbytes_last;
  int nbytes_total;
  int request_len;
  char request [1024];
  size_t BUF_SIZE;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7a0;
  char *in_stack_fffffffffffff7a8;
  allocator *paVar5;
  ulong local_838;
  allocator *in_stack_fffffffffffff7e0;
  string *in_stack_fffffffffffff7e8;
  string *in_stack_fffffffffffff7f0;
  string *in_stack_fffffffffffff7f8;
  string *in_stack_fffffffffffff800;
  allocator local_791;
  string local_790 [39];
  allocator local_769;
  string local_768 [39];
  allocator local_741;
  string local_740 [39];
  allocator local_719;
  string local_718 [36];
  int local_6f4;
  ulong local_6f0;
  ulong local_6e8;
  allocator local_6d9;
  string local_6d8 [39];
  allocator local_6b1;
  string local_6b0 [39];
  allocator local_689;
  string local_688 [39];
  undefined1 local_661 [37];
  int local_63c;
  int local_638;
  undefined1 local_631 [40];
  undefined1 local_609 [40];
  undefined1 local_5e1 [40];
  allocator local_5b9;
  string local_5b8 [39];
  allocator local_591;
  string local_590 [39];
  allocator local_569;
  string local_568 [39];
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [39];
  allocator local_4b1;
  string local_4b0 [39];
  allocator local_489;
  string local_488 [55];
  allocator local_451;
  string local_450 [36];
  int local_42c;
  char local_428 [1024];
  undefined8 local_28;
  long local_20;
  ulong local_18;
  long local_10;
  
  local_28 = 0x2000;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  memset(local_428,0,0x400);
  __format = (char *)std::__cxx11::string::c_str();
  uVar2 = std::__cxx11::string::c_str();
  uVar3 = std::__cxx11::string::c_str();
  local_42c = snprintf(local_428,0x400,__format,uVar2,uVar3,local_20,local_20 + local_18 + -1);
  if (0x3ff < local_42c) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_450,"Toolkit",&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_488,"transport::file::FileHTTP",&local_489);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4b0,"Read",&local_4b1);
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff7e8 >> 0x20));
    std::operator+(in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0);
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
               in_stack_fffffffffffff7e8,(int)((ulong)in_stack_fffffffffffff7e0 >> 0x20));
    std::__cxx11::string::~string(local_4d8);
    std::__cxx11::string::~string(local_4f8);
    std::__cxx11::string::~string(local_4b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
    std::__cxx11::string::~string(local_488);
    std::allocator<char>::~allocator((allocator<char> *)&local_489);
    std::__cxx11::string::~string(local_450);
    std::allocator<char>::~allocator((allocator<char> *)&local_451);
  }
  iVar1 = socket(2,1,*(int *)(in_RDI + 0x154));
  *(int *)(in_RDI + 0xf0) = iVar1;
  if (*(int *)(in_RDI + 0xf0) == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_518,"Toolkit",&local_519);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_540,"transport::file::FileHTTP",&local_541);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_568,"Read",&local_569);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_590,"cannot open socket",&local_591);
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
               in_stack_fffffffffffff7e8,(int)((ulong)in_stack_fffffffffffff7e0 >> 0x20));
    std::__cxx11::string::~string(local_590);
    std::allocator<char>::~allocator((allocator<char> *)&local_591);
    std::__cxx11::string::~string(local_568);
    std::allocator<char>::~allocator((allocator<char> *)&local_569);
    std::__cxx11::string::~string(local_540);
    std::allocator<char>::~allocator((allocator<char> *)&local_541);
    std::__cxx11::string::~string(local_518);
    std::allocator<char>::~allocator((allocator<char> *)&local_519);
  }
  iVar1 = connect(*(int *)(in_RDI + 0xf0),(sockaddr *)(in_RDI + 0x144),0x10);
  if (iVar1 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5b8,"Toolkit",&local_5b9);
    in_stack_fffffffffffff800 = (string *)local_5e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_5e1 + 1),"transport::file::FileHTTP",
               (allocator *)in_stack_fffffffffffff800);
    in_stack_fffffffffffff7f8 = (string *)local_609;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_609 + 1),"Read",(allocator *)in_stack_fffffffffffff7f8);
    in_stack_fffffffffffff7f0 = (string *)local_631;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_631 + 1),"cannot connect",(allocator *)in_stack_fffffffffffff7f0);
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
               in_stack_fffffffffffff7e8,(int)((ulong)in_stack_fffffffffffff7e0 >> 0x20));
    std::__cxx11::string::~string((string *)(local_631 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_631);
    std::__cxx11::string::~string((string *)(local_609 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_609);
    std::__cxx11::string::~string((string *)(local_5e1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_5e1);
    std::__cxx11::string::~string(local_5b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  }
  for (local_638 = 0; local_638 < local_42c; local_638 = local_63c + local_638) {
    sVar4 = ::write(*(int *)(in_RDI + 0xf0),local_428 + local_638,(long)(local_42c - local_638));
    local_63c = (int)sVar4;
    if (local_63c == -1) {
      in_stack_fffffffffffff7e8 = (string *)local_661;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_661 + 1),"Toolkit",(allocator *)in_stack_fffffffffffff7e8);
      in_stack_fffffffffffff7e0 = &local_689;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_688,"transport::file::FileHTTP",in_stack_fffffffffffff7e0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6b0,"Read",&local_6b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6d8,"cannot send request",&local_6d9);
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
                 in_stack_fffffffffffff7e8,(int)((ulong)in_stack_fffffffffffff7e0 >> 0x20));
      std::__cxx11::string::~string(local_6d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
      std::__cxx11::string::~string(local_6b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
      std::__cxx11::string::~string(local_688);
      std::allocator<char>::~allocator((allocator<char> *)&local_689);
      std::__cxx11::string::~string((string *)(local_661 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_661);
    }
  }
  for (local_6e8 = 0; local_6e8 < local_18; local_6e8 = (long)local_638 + local_6e8) {
    local_6f0 = local_18 - local_6e8;
    local_838 = local_6f0;
    if (0x1fff < local_6f0) {
      local_838 = 0x2000;
    }
    local_6f4 = (int)local_838;
    sVar4 = read(*(int *)(in_RDI + 0xf0),(void *)(local_10 + local_6e8),(long)local_6f4);
    local_638 = (int)sVar4;
    if (local_638 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_718,"Toolkit",&local_719);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_740,"transport::file::FileHTTP",&local_741);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_768,"Read",&local_769);
      paVar5 = &local_791;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_790,"cannot get response",paVar5);
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
                 in_stack_fffffffffffff7e8,(int)((ulong)in_stack_fffffffffffff7e0 >> 0x20));
      std::__cxx11::string::~string(local_790);
      std::allocator<char>::~allocator((allocator<char> *)&local_791);
      std::__cxx11::string::~string(local_768);
      std::allocator<char>::~allocator((allocator<char> *)&local_769);
      std::__cxx11::string::~string(local_740);
      std::allocator<char>::~allocator((allocator<char> *)&local_741);
      std::__cxx11::string::~string(local_718);
      std::allocator<char>::~allocator((allocator<char> *)&local_719);
    }
  }
  close(*(int *)(in_RDI + 0xf0));
  return;
}

Assistant:

void FileHTTP::Read(char *buffer, size_t size, size_t start)
{
    /* not using BUFSIZ, the server might use another value for that */
    const size_t BUF_SIZE = 8192;
    enum CONSTEXPR
    {
        MAX_REQUEST_LEN = 1024
    };
    char request[MAX_REQUEST_LEN] = {'\0'};
    int request_len = snprintf(request, MAX_REQUEST_LEN, request_template.c_str(), m_Name.c_str(),
                               m_hostname.c_str(), start, start + size - 1);
    if (request_len >= MAX_REQUEST_LEN)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "Read",
                                              "request length too long:  " +
                                                  std::to_string(request_len));
    }
    m_socketFileDescriptor = socket(AF_INET, SOCK_STREAM, m_p_proto);
    if (m_socketFileDescriptor == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "Read",
                                              "cannot open socket");
    }
    /* Actually connect. */
    if (connect(m_socketFileDescriptor, (struct sockaddr *)&sockaddr_in, sizeof(sockaddr_in)) == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "Read",
                                              "cannot connect");
    }
    /* Send HTTP request. */
    int nbytes_total = 0;
    while (nbytes_total < request_len)
    {
        int nbytes_last =
            write(m_socketFileDescriptor, request + nbytes_total, request_len - nbytes_total);
        if (nbytes_last == -1)
        {
            helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "Read",
                                                  "cannot send request");
        }
        nbytes_total += nbytes_last;
    }

    /* Read the response. */
    size_t bytes_recd = 0;
    while (bytes_recd < size)
    {
        size_t remaining = size - bytes_recd;
        int read_len = (int)(remaining < BUF_SIZE ? remaining : BUF_SIZE);
        nbytes_total = read(m_socketFileDescriptor, buffer + bytes_recd, read_len);
        if (nbytes_total == -1)
        {
            helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "Read",
                                                  "cannot get response");
        }
        bytes_recd += nbytes_total;
    }

    close(m_socketFileDescriptor);
    return;
}